

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstorage.c
# Opt level: O0

void string_storage_enumerate_recursive
               (string_struct *ss,string_storage_enumerate_callback cb,void *user_data,char *parent,
               size_t user_data_size)

{
  byte bVar1;
  void *in_RCX;
  string_storage_enumerate_callback in_RDX;
  string_struct *in_RSI;
  long in_RDI;
  char *in_R8;
  uint8_t prev;
  size_t i;
  char buf [256];
  ulong local_130;
  char local_128 [248];
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  
  for (local_130 = 0; local_130 < *(ulong *)(in_RDI + 8); local_130 = local_130 + 1) {
    bVar1 = **(byte **)(*(long *)(in_RDI + 0x10) + local_130 * 0x18);
    memcpy(local_128,in_RCX,(ulong)bVar1);
    strncpy(local_128 + (int)(uint)bVar1,
            in_R8 + *(long *)(*(long *)(in_RDI + 0x10) + local_130 * 0x18) + 1,
            (long)(int)(0xff - (uint)bVar1));
    uVar2 = 0;
    (*(code *)in_RSI)(in_RDX,local_128,*(long *)(*(long *)(in_RDI + 0x10) + local_130 * 0x18) + 1);
    string_storage_enumerate_recursive
              (in_RSI,in_RDX,in_RCX,in_R8,CONCAT17(uVar2,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void string_storage_enumerate_recursive(const struct string_struct *ss, string_storage_enumerate_callback cb, void *user_data, const char *parent, size_t user_data_size)
{
	char buf[256];
	size_t i;
	for (i = 0; i < ss->child_count; i++)
	{
		uint8_t prev = *(uint8_t*)ss->children[i].value;
		memcpy(buf, parent, prev);
		strncpy(buf + prev, ss->children[i].value + 1 + user_data_size, 255 - prev);
		buf[255] = 0;
		cb(user_data, buf, ss->children[i].value + 1);
		string_storage_enumerate_recursive(&ss->children[i], cb, user_data, buf, user_data_size);
	}
}